

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebugIfHasDebugStreamContainer<QList<QVariant>,_QVariant>
operator<<(QDebug debug,QList<QVariant> *vec)

{
  QList<QVariant> *in_RDX;
  long in_FS_OFFSET;
  Data *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (vec->d).d;
  (vec->d).d = (Data *)0x0;
  QtPrivate::printSequentialContainer<QList<QVariant>>
            ((QtPrivate *)debug.stream,(Stream *)&local_20,"QList",in_RDX);
  QDebug::~QDebug((QDebug *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QDebugIfHasDebugStreamContainer<QList<QVariant>,_QVariant>)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStreamContainer<QList<T>, T> operator<<(QDebug debug, const QList<T> &vec)
{
    return QtPrivate::printSequentialContainer(std::move(debug), "QList", vec);
}